

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImDrawList::PopTextureID(ImDrawList *this)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = (this->_TextureIdStack).Size;
  if (0 < (long)iVar1) {
    (this->_TextureIdStack).Size = iVar1 + -1;
    if (iVar1 + -1 == 0) {
      pvVar2 = (void *)0x0;
    }
    else {
      pvVar2 = (this->_TextureIdStack).Data[(long)iVar1 + -2];
    }
    (this->_CmdHeader).TextureId = pvVar2;
    _OnChangedTextureID(this);
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui.h"
                ,0x65a,"void ImVector<void *>::pop_back() [T = void *]");
}

Assistant:

inline void         pop_back()                          { IM_ASSERT(Size > 0); Size--; }